

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::crate::CrateReader::ReadIntArray<unsigned_long>
          (CrateReader *this,bool is_compressed,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *d)

{
  ulong uVar1;
  pointer puVar2;
  unsigned_long *out;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  uint64_t uVar9;
  size_t sz;
  StreamReader *pSVar10;
  ulong uVar11;
  uint32_t n;
  uint32_t shapesize;
  ostringstream ss_e;
  long *local_1d8;
  long local_1c8 [2];
  uint local_1b4;
  ulong local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar3 = StreamReader::read4(this->_sr,(uint32_t *)&local_1b0);
    if (bVar3) {
      bVar3 = StreamReader::read4(this->_sr,&local_1b4);
      if (bVar3) {
        uVar11 = (ulong)local_1b4;
        goto LAB_001e1627;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIntArray",0xc);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      iVar7 = 0x16b;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIntArray",0xc);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      iVar7 = 0x166;
    }
  }
  else {
    bVar3 = StreamReader::read8(this->_sr,&local_1b0);
    uVar11 = local_1b0;
    if (bVar3) {
LAB_001e1627:
      if (uVar11 == 0) {
        puVar2 = (d->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((d->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish == puVar2) {
          return true;
        }
        (d->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar2;
        return true;
      }
      if ((this->_config).maxArrayElements < uVar11) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadIntArray",0xc);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x180);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar8 = "Too large array elements.";
        lVar6 = 0x19;
      }
      else {
        uVar1 = uVar11 * 8;
        uVar5 = this->_memoryUsage + uVar1;
        this->_memoryUsage = uVar5;
        if ((this->_config).maxMemoryBudget < uVar5) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadIntArray",0xc);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x183);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar8 = "Reached to max memory budget.";
          lVar6 = 0x1d;
        }
        else {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(d,uVar11);
          if (is_compressed) {
            if (0xf < uVar11) {
              out = (d->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start;
              bVar3 = ReadCompressedInts<unsigned_long>
                                (this,out,(long)(d->
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)out >> 3);
              return bVar3;
            }
            pSVar10 = this->_sr;
            uVar9 = pSVar10->idx_;
            uVar11 = pSVar10->length_ - uVar9;
            if (uVar9 + uVar1 <= pSVar10->length_) {
              uVar11 = uVar1;
            }
            if (uVar11 - 1 < uVar1) {
LAB_001e1b64:
              memcpy((d->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start,pSVar10->binary_ + uVar9,uVar11);
              pSVar10->idx_ = pSVar10->idx_ + uVar11;
              return true;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadIntArray",0xc);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x197);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            pcVar8 = "Failed to read uncompressed integer array data.";
            lVar6 = 0x2f;
          }
          else {
            pSVar10 = this->_sr;
            uVar9 = pSVar10->idx_;
            uVar11 = pSVar10->length_ - uVar9;
            if (uVar9 + uVar1 <= pSVar10->length_) {
              uVar11 = uVar1;
            }
            if (uVar11 - 1 < uVar1) goto LAB_001e1b64;
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReadIntArray",0xc);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,0x18c);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            pcVar8 = "Failed to read integer array data.";
            lVar6 = 0x22;
          }
        }
      }
      goto LAB_001e18ce;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadIntArray",0xc);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    iVar7 = 0x171;
  }
  poVar4 = (ostream *)::std::ostream::operator<<(local_1a8,iVar7);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pcVar8 = "Failed to read the number of array elements.";
  lVar6 = 0x2c;
LAB_001e18ce:
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar8,lVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadIntArray(bool is_compressed, std::vector<T> *d) {

  size_t length{0}; // uncompressed array elements.
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }

    DCOUT("array.len = " << n);
    length = size_t(n);
  }

  DCOUT("array.len = " << length);
  if (length == 0) {
    d->clear();
    return true;
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too large array elements.");
  }

  CHECK_MEMORY_USAGE(sizeof(T) * length);

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(T) * length, sizeof(T) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read integer array data.");
    }

    return true;

  } else {

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(T) * length;
      // Not stored in compressed for smaller data
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read uncompressed integer array data.");
      }
      return true;
    }

    return ReadCompressedInts(d->data(), d->size());
  }
}